

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Vec_Int_t * Acec_RankTrees(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vXorRoots)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint i;
  uint uVar4;
  int i_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntStartFull(p->nObjs);
  for (iVar7 = 0; iVar7 < vXorRoots->nSize; iVar7 = iVar7 + 1) {
    iVar2 = Vec_IntEntry(vXorRoots,iVar7);
    Vec_IntWriteEntry(p_01,iVar2,iVar7);
  }
  uVar1 = (long)vXors->nSize / 4;
  uVar5 = uVar1 & 0xffffffff;
  iVar7 = (int)uVar1 << 2;
  while (0 < (int)uVar5) {
    uVar3 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar3;
    iVar2 = Vec_IntEntry(vXors,uVar3 * 4);
    uVar3 = Vec_IntEntry(p_01,iVar2);
    if (uVar3 != 0xffffffff) {
      for (iVar2 = -3; iVar2 != 0; iVar2 = iVar2 + 1) {
        i = Vec_IntEntry(vXors,iVar2 + iVar7);
        if ((i != 0) && (uVar4 = Vec_IntEntry(p_01,i), uVar4 != uVar3)) {
          if (uVar4 == 0xffffffff) {
            Vec_IntWriteEntry(p_01,i,uVar3);
          }
          else {
            Vec_IntPush(p_00,i);
            pGVar6 = Gia_ManObj(p,i);
            if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
              printf("Xor node %d belongs to Tree %d and Tree %d.\n",(ulong)i,(ulong)uVar4,
                     (ulong)uVar3);
            }
          }
        }
      }
    }
    iVar7 = iVar7 + -4;
  }
  iVar2 = 0;
  iVar7 = p_00->nSize;
  if (p_00->nSize < 1) {
    iVar7 = iVar2;
  }
  for (; iVar7 != iVar2; iVar2 = iVar2 + 1) {
    i_00 = Vec_IntEntry(p_00,iVar2);
    Vec_IntWriteEntry(p_01,i_00,-1);
  }
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Acec_RankTrees( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vXorRoots )
{
    Vec_Int_t * vDoubles = Vec_IntAlloc( 100 );
    int i, k, Entry;
    // map roots into their ranks
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) ); 
    Vec_IntForEachEntry( vXorRoots, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, i );
    // map nodes into their ranks
    for ( i = Vec_IntSize(vXors)/4 - 1; i >= 0; i-- )
    {
        int Root = Vec_IntEntry( vXors, 4*i );
        int Rank = Vec_IntEntry( vRanks, Root );
        // skip XORs that are not part of any tree
        if ( Rank == -1 )
            continue;
        // iterate through XOR inputs
        for ( k = 1; k < 4; k++ )
        {
            int Node = Vec_IntEntry( vXors, 4*i+k );
            if ( Node == 0 ) // HA
                continue;
            Entry = Vec_IntEntry( vRanks, Node );
            if ( Entry == Rank ) // the same tree
                continue;
            if ( Entry == -1 )
                Vec_IntWriteEntry( vRanks, Node, Rank );
            else
                Vec_IntPush( vDoubles, Node );

            if ( Entry != -1 && Gia_ObjIsAnd(Gia_ManObj(p, Node)))
            printf( "Xor node %d belongs to Tree %d and Tree %d.\n", Node, Entry, Rank );
        }
    }
    // remove duplicated entries
    Vec_IntForEachEntry( vDoubles, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, -1 );
    Vec_IntFree( vDoubles );
    return vRanks;
}